

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdial.cpp
# Opt level: O3

void __thiscall QDial::mouseReleaseEvent(QDial *this,QMouseEvent *e)

{
  QDialPrivate *this_00;
  bool bVar1;
  int value;
  long in_FS_OFFSET;
  double dVar2;
  undefined1 auVar3 [16];
  QPoint local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(int *)(e + 0x40) == 1) && ((*(uint *)(e + 0x44) & 0xfffffffe) == 0)) {
    this_00 = *(QDialPrivate **)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
    e[0xc] = (QMouseEvent)0x1;
    auVar3 = QEventPoint::position();
    dVar2 = (double)((ulong)auVar3._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar3._0_8_;
    bVar1 = 2147483647.0 < dVar2;
    if (dVar2 <= -2147483648.0) {
      dVar2 = -2147483648.0;
    }
    local_20.xp.m_i =
         (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar2);
    dVar2 = (double)((ulong)auVar3._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) + auVar3._8_8_;
    bVar1 = 2147483647.0 < dVar2;
    if (dVar2 <= -2147483648.0) {
      dVar2 = -2147483648.0;
    }
    local_20.yp.m_i =
         (int)(double)(-(ulong)bVar1 & 0x41dfffffffc00000 | ~-(ulong)bVar1 & (ulong)dVar2);
    value = QDialPrivate::valueFromPoint(this_00,&local_20);
    QAbstractSlider::setValue(&this->super_QAbstractSlider,value);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QAbstractSlider::setSliderDown(&this->super_QAbstractSlider,false);
      return;
    }
  }
  else {
    e[0xc] = (QMouseEvent)0x0;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QDial::mouseReleaseEvent(QMouseEvent * e)
{
    Q_D(QDial);
    if (e->buttons() & (~e->button()) ||
       (e->button() != Qt::LeftButton)) {
        e->ignore();
        return;
    }
    e->accept();
    setValue(d->valueFromPoint(e->position().toPoint()));
    setSliderDown(false);
}